

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cc
# Opt level: O1

char * Varint::Parse64WithLimit(char *p,char *l,uint64 *OUTPUT)

{
  char *pcVar1;
  ulong uVar2;
  byte *pbVar3;
  
  if (p + 10 <= l) {
    if (-1 < (long)*p) {
      *OUTPUT = (long)*p;
      return p + 1;
    }
    pcVar1 = Parse64Fallback(p,OUTPUT);
    return pcVar1;
  }
  if (l <= p) {
    return (char *)0x0;
  }
  pbVar3 = (byte *)(p + 1);
  uVar2 = (ulong)(byte)*p;
  if (*p < '\0') {
    if (l <= pbVar3) {
      return (char *)0x0;
    }
    pbVar3 = (byte *)(p + 2);
    uVar2 = uVar2 - 0x80 | (ulong)(byte)p[1] << 7;
    if (p[1] < '\0') {
      if (l <= pbVar3) {
        return (char *)0x0;
      }
      pbVar3 = (byte *)(p + 3);
      uVar2 = uVar2 - 0x4000 | (ulong)(byte)p[2] << 0xe;
      if (p[2] < '\0') {
        if (l <= pbVar3) {
          return (char *)0x0;
        }
        pbVar3 = (byte *)(p + 4);
        uVar2 = (uVar2 + (ulong)(byte)p[3] * 0x200000) - 0x200000;
        if (p[3] < '\0') {
          if (l <= pbVar3) {
            return (char *)0x0;
          }
          pbVar3 = (byte *)(p + 5);
          uVar2 = (uVar2 + (ulong)(byte)p[4] * 0x10000000) - 0x10000000;
          if (p[4] < '\0') {
            if (l <= pbVar3) {
              return (char *)0x0;
            }
            pbVar3 = (byte *)(p + 6);
            uVar2 = uVar2 + ((ulong)(byte)p[5] << 0x23) + -0x800000000;
            if (p[5] < '\0') {
              if (l <= pbVar3) {
                return (char *)0x0;
              }
              pbVar3 = (byte *)(p + 7);
              uVar2 = uVar2 + ((ulong)(byte)p[6] << 0x2a) + -0x40000000000;
              if (p[6] < '\0') {
                if (l <= pbVar3) {
                  return (char *)0x0;
                }
                pbVar3 = (byte *)(p + 8);
                uVar2 = uVar2 + ((ulong)(byte)p[7] << 0x31) + -0x2000000000000;
                if (p[7] < '\0') {
                  if (l <= pbVar3) {
                    return (char *)0x0;
                  }
                  pbVar3 = (byte *)(p + 9);
                  uVar2 = uVar2 + ((ulong)(byte)p[8] << 0x38) + -0x100000000000000;
                  if (p[8] < '\0') {
                    if (l <= pbVar3) {
                      return (char *)0x0;
                    }
                    if (1 < *pbVar3) {
                      return (char *)0x0;
                    }
                    uVar2 = uVar2 + ((ulong)~(uint)*pbVar3 << 0x3f);
                    pbVar3 = (byte *)(p + 10);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *OUTPUT = uVar2;
  return (char *)pbVar3;
}

Assistant:

const char* Varint::Parse64WithLimit(const char* p,
                                     const char* l,
                                     uint64* OUTPUT) {
  if (p + kMax64 <= l) {
    return Parse64(p, OUTPUT);
  } else {
    // See detailed comment in Varint::Parse64Fallback about this general
    // approach.
    const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
    const unsigned char* limit = reinterpret_cast<const unsigned char*>(l);
    uint64 b, result;
#if defined(__x86_64__)
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result = b;              if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) <<  7; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 14; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 21; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 28; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 35; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 42; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 49; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 56; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 63; if (b < 2) goto done;
    return nullptr;       // Value is too long to be a varint64
#else
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result = b & 127;          if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) <<  7; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 14; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 21; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 28; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 35; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 42; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 49; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 56; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 63; if (b < 2) goto done;
    return nullptr;       // Value is too long to be a varint64
#endif
   done:
    *OUTPUT = result;
    return reinterpret_cast<const char*>(ptr);
  }
}